

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Seq::gen(Seq *this,int b,int a)

{
  bool bVar1;
  uint i;
  element_type *peVar2;
  int label;
  int a_local;
  int b_local;
  Seq *this_local;
  
  bVar1 = std::operator==(&this->stmt1,&Stmt::Null);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->stmt2);
    (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)(uint)b,(ulong)(uint)a);
  }
  else {
    bVar1 = std::operator==(&this->stmt2,&Stmt::Null);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->stmt1);
      (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)(uint)b,(ulong)(uint)a);
    }
    else {
      i = Node::newlabel((Node *)this);
      peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->stmt1);
      (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)(uint)b,(ulong)i);
      Node::emitlabel((Node *)this,i);
      peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->stmt2);
      (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)i,(ulong)(uint)a);
    }
  }
  return;
}

Assistant:

void gen(int b, int a) override {
		if (stmt1 == Stmt::Null) stmt2->gen(b, a);
		else if (stmt2 == Stmt::Null) stmt1->gen(b, a);
		else {
			int label = newlabel();
			stmt1->gen(b, label);
			emitlabel(label);
			stmt2->gen(label, a);
		}
	}